

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O1

void __thiscall CorUnix::CSynchData::SharedWaiterEnqueue(CSynchData *this,SHMPTR shridNewNode)

{
  CSynchData *pCVar1;
  undefined8 *puVar2;
  SHMPTR shmptr;
  
  if (this->m_odObjectDomain != SharedObject) {
    fprintf(_stderr,"] %s %s:%d","SharedWaiterEnqueue",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x751);
    fprintf(_stderr,
            "Expression: SharedObject == GetObjectDomain(), Description: Trying to enqueue a WaitingThreadsListNode as shared on a local object\n"
           );
  }
  shmptr = (this->m_ptrWTLTail).shrid;
  pCVar1 = (CSynchData *)SHMPtrToPtr(shmptr);
  puVar2 = (undefined8 *)SHMPtrToPtr(shridNewNode);
  if ((*(byte *)((long)puVar2 + 0x24) & 1) == 0) {
    fprintf(_stderr,"] %s %s:%d","SharedWaiterEnqueue",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x75c);
    fprintf(_stderr,
            "Expression: 1 == (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnNewNode->dwFlags), Description: Trying to add a WaitingThreadsListNode marked as local as it was a shared one\n"
           );
  }
  *puVar2 = 0;
  if (pCVar1 == (CSynchData *)0x0) {
    if ((this->m_ptrWTLHead).shrid != 0) {
      fprintf(_stderr,"] %s %s:%d","SharedWaiterEnqueue",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x765);
      fprintf(_stderr,
              "Expression: NULLSharedID == m_ptrWTLHead.shrid, Description: Corrupted waiting list on shared CSynchData at {shrid=%p, p=%p}\n"
              ,this->m_shridThis,this);
    }
    shmptr = 0;
    pCVar1 = this;
  }
  puVar2[1] = shmptr;
  (pCVar1->m_ptrWTLHead).shrid = shridNewNode;
  (this->m_ptrWTLTail).shrid = shridNewNode;
  this->m_ulcWaitingThreads = this->m_ulcWaitingThreads + 1;
  return;
}

Assistant:

void CSynchData::SharedWaiterEnqueue(SharedID shridNewNode)
    {
        VALIDATEOBJECT(this);

        _ASSERT_MSG(SharedObject == GetObjectDomain(),
                    "Trying to enqueue a WaitingThreadsListNode as shared "
                    "on a local object\n");

        SharedID shridCurrLast;
        WaitingThreadsListNode * pwtlnCurrLast, * pwtlnNewNode;

        shridCurrLast = m_ptrWTLTail.shrid;
        pwtlnCurrLast = SharedIDToTypePointer(WaitingThreadsListNode, shridCurrLast);
        pwtlnNewNode = SharedIDToTypePointer(WaitingThreadsListNode, shridNewNode);

        _ASSERT_MSG(1 == (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnNewNode->dwFlags),
                    "Trying to add a WaitingThreadsListNode marked as local "
                    "as it was a shared one\n");        

        VALIDATEOBJECT(pwtlnNewNode);

        pwtlnNewNode->ptrNext.shrid = NULLSharedID;
        if (NULL == pwtlnCurrLast)
        {
            _ASSERT_MSG(NULLSharedID == m_ptrWTLHead.shrid, 
                        "Corrupted waiting list on shared CSynchData at "
                        "{shrid=%p, p=%p}\n", m_shridThis, this);
            
            pwtlnNewNode->ptrPrev.shrid = NULLSharedID;
            m_ptrWTLHead.shrid = shridNewNode;
            m_ptrWTLTail.shrid = shridNewNode;
        }
        else
        {
            VALIDATEOBJECT(pwtlnCurrLast);
            
            pwtlnNewNode->ptrPrev.shrid = shridCurrLast;
            pwtlnCurrLast->ptrNext.shrid = shridNewNode;                
            m_ptrWTLTail.shrid = shridNewNode;
        }

        m_ulcWaitingThreads += 1;

        return;
    }